

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

vector<double> * __thiscall
mat_lib::vector<double>::operator+
          (vector<double> *__return_storage_ptr__,vector<double> *this,vector<double> *rhs)

{
  size_t sVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  logic_error *this_00;
  size_t sVar5;
  
  if (this->max_size__ == rhs->max_size__) {
    vector(__return_storage_ptr__,this->max_size__);
    sVar1 = rhs->max_size__;
    if (sVar1 != 0) {
      pdVar2 = (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (rhs->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (__return_storage_ptr__->container__).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      sVar5 = 0;
      do {
        pdVar4[sVar5] = pdVar2[sVar5] + pdVar3[sVar5];
        sVar5 = sVar5 + 1;
      } while (sVar1 != sVar5);
    }
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"bad sum operations");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

vector operator+(const vector &rhs){
          if(this->size() != rhs.size()) throw logic_error("bad sum operations");
          vector<element_t> res(this->size());

          for (int i = 0; i < rhs.size(); ++i) {
              res.set(i,container__[i] + rhs[i]);
          }

          return res;
      }